

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O2

void parse_util::parse_double(string *nums,double *res,string *unit)

{
  long lVar1;
  double dVar2;
  string tmp;
  string snum;
  string symb;
  string local_80;
  char *local_60 [4];
  string local_40 [32];
  
  remove_spaces(&local_80,nums);
  std::__cxx11::string::string(local_40,"smnu",(allocator *)local_60);
  lVar1 = std::__cxx11::string::find_first_of((string *)&local_80,(ulong)local_40);
  if (lVar1 == -1) {
    std::__cxx11::string::assign((char *)unit);
  }
  else {
    std::__cxx11::string::substr((ulong)local_60,(ulong)&local_80);
    std::__cxx11::string::operator=((string *)unit,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::substr((ulong)local_60,(ulong)&local_80);
  dVar2 = atof(local_60[0]);
  *res = dVar2;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void parse_double(const string &nums, double &res, string &unit)
    {
        string tmp = remove_spaces(nums);
        string::size_type pos = 0;
        string symb = "smnu";

        pos = tmp.find_first_of(symb, pos);

        if (pos != string::npos)
            unit = tmp.substr(pos, tmp.size() - pos);
        else unit = "";

        string snum = tmp.substr(0,pos);
        res = atof(snum.c_str());
    }